

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_posix.hpp
# Opt level: O0

void __thiscall
chaiscript::detail::Loadable_Module::DLModule::DLModule(DLModule *this,string *t_filename)

{
  char *pcVar1;
  void *pvVar2;
  load_module_error *this_00;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *t_filename_local;
  DLModule *this_local;
  
  local_18 = t_filename;
  t_filename_local = (string *)this;
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (t_filename);
  pvVar2 = (void *)dlopen(pcVar1,2);
  this->m_data = pvVar2;
  if (this->m_data == (void *)0x0) {
    this_00 = (load_module_error *)__cxa_allocate_exception(0x10);
    pcVar1 = (char *)dlerror();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar1,&local_39);
    chaiscript::exception::load_module_error::load_module_error(this_00,&local_38);
    __cxa_throw(this_00,&chaiscript::exception::load_module_error::typeinfo,
                chaiscript::exception::load_module_error::~load_module_error);
  }
  return;
}

Assistant:

explicit DLModule(const std::string &t_filename)
          : m_data(dlopen(t_filename.c_str(), RTLD_NOW)) {
        if (m_data == nullptr) {
          throw chaiscript::exception::load_module_error(dlerror());
        }
      }